

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

basic_variable<std::allocator<char>_> * __thiscall
trial::protocol::bintoken::parse<unsigned_char[33],std::allocator<char>>
          (basic_variable<std::allocator<char>_> *__return_storage_ptr__,bintoken *this,
          uchar (*input) [33])

{
  value vVar1;
  error *this_00;
  basic_parser<std::allocator<char>_> parser;
  reader reader;
  basic_parser<std::allocator<char>_> local_98;
  reader local_90;
  
  bintoken::reader::reader<unsigned_char[33]>(&local_90,(uchar (*) [33])this);
  local_98.reader = &local_90;
  detail::basic_parser<std::allocator<char>_>::parse(__return_storage_ptr__,&local_98);
  vVar1 = token::symbol::convert(local_90.decoder.current.code);
  if (vVar1 == end) {
    std::
    _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
    ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                    *)&local_90.stack);
    return __return_storage_ptr__;
  }
  this_00 = (error *)__cxa_allocate_exception(0x20);
  error::error(this_00,unexpected_token);
  __cxa_throw(this_00,&error::typeinfo,std::system_error::~system_error);
}

Assistant:

auto parse(const U& input) -> dynamic::basic_variable<Allocator>
{
    bintoken::reader reader(input);
    auto result = partial::parse(reader);
    if (reader.symbol() != bintoken::token::symbol::end)
        throw bintoken::error(bintoken::unexpected_token);
    return result;
}